

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O0

int base64_stream_decode_sse41(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  int iVar2;
  undefined4 local_78;
  int local_74;
  base64_state st;
  size_t slen;
  size_t olen;
  byte *pbStack_50;
  uint8_t q;
  uint8_t *o;
  uint8_t *s;
  size_t *psStack_38;
  int ret;
  size_t *outlen_local;
  char *out_local;
  size_t srclen_local;
  char *src_local;
  base64_state *state_local;
  
  s._4_4_ = 0;
  slen = 0;
  iVar2 = state->eof;
  local_74 = state->bytes;
  st.bytes._0_1_ = state->carry;
  if (iVar2 == 0) {
    local_78 = 0;
    st._8_8_ = srclen;
    pbStack_50 = (byte *)out;
    o = (uint8_t *)src;
    psStack_38 = outlen;
    outlen_local = (size_t *)out;
    out_local = (char *)srclen;
    srclen_local = (size_t)src;
    src_local = (char *)state;
    switch(local_74) {
    case 0:
      while( true ) {
        dec_loop_ssse3(&o,(size_t *)&st.flags,&stack0xffffffffffffffb0,&slen);
        if (st._8_8_ == 0) break;
        if (0xfd < base64_table_dec_8bit[*o]) {
          local_78 = 2;
          goto switchD_00106599_default;
        }
        st.bytes._0_1_ = base64_table_dec_8bit[*o] << 2;
        local_74 = local_74 + 1;
        st._8_8_ = st._8_8_ + -1;
        o = o + 1;
switchD_00106599_caseD_1:
        if (st._8_8_ == 0) {
          s._4_4_ = 1;
          goto switchD_00106599_default;
        }
        bVar1 = base64_table_dec_8bit[*o];
        if (0xfd < bVar1) {
          local_78 = 2;
          goto switchD_00106599_default;
        }
        *pbStack_50 = (byte)st.bytes | (byte)((int)(uint)bVar1 >> 4);
        st.bytes._0_1_ = bVar1 << 4;
        local_74 = local_74 + 1;
        slen = slen + 1;
        st._8_8_ = st._8_8_ + -1;
        pbStack_50 = pbStack_50 + 1;
        o = o + 1;
switchD_00106599_caseD_2:
        if (st._8_8_ == 0) {
          s._4_4_ = 1;
          goto switchD_00106599_default;
        }
        bVar1 = base64_table_dec_8bit[*o];
        if (0xfd < bVar1) {
          local_74 = local_74 + 1;
          if (bVar1 == 0xfe) {
            if (st._8_8_ + -1 == 0) {
              local_78 = 1;
              s._4_4_ = 1;
            }
            else {
              local_74 = 0;
              local_78 = 2;
              s._4_4_ = (uint)(base64_table_dec_8bit[o[1]] == 0xfe && st._8_8_ == 2);
            }
          }
          goto switchD_00106599_default;
        }
        *pbStack_50 = (byte)st.bytes | (byte)((int)(uint)bVar1 >> 2);
        st.bytes._0_1_ = bVar1 << 6;
        local_74 = local_74 + 1;
        slen = slen + 1;
        st._8_8_ = st._8_8_ + -1;
        pbStack_50 = pbStack_50 + 1;
        o = o + 1;
switchD_00106599_caseD_3:
        if (st._8_8_ == 0) {
          s._4_4_ = 1;
          goto switchD_00106599_default;
        }
        olen._7_1_ = base64_table_dec_8bit[*o];
        if (0xfd < olen._7_1_) {
          local_74 = 0;
          local_78 = 2;
          s._4_4_ = (uint)(olen._7_1_ == 0xfe && st._8_8_ + -1 == 0);
          goto switchD_00106599_default;
        }
        *pbStack_50 = (byte)st.bytes | olen._7_1_;
        st.bytes._0_1_ = 0;
        local_74 = 0;
        slen = slen + 1;
        st._8_8_ = st._8_8_ + -1;
        pbStack_50 = pbStack_50 + 1;
        o = o + 1;
      }
      s._4_4_ = 1;
      break;
    case 1:
      goto switchD_00106599_caseD_1;
    case 2:
      goto switchD_00106599_caseD_2;
    case 3:
      goto switchD_00106599_caseD_3;
    }
switchD_00106599_default:
    *(undefined4 *)src_local = local_78;
    *(int *)(src_local + 4) = local_74;
    src_local[0xc] = (byte)st.bytes;
    *psStack_38 = slen;
    state_local._4_4_ = s._4_4_;
  }
  else {
    *outlen = 0;
    s._4_4_ = 0;
    if ((srclen != 0) && (iVar2 == 1)) {
      state->bytes = 0;
      state->eof = 2;
      s._4_4_ = (uint)(base64_table_dec_8bit[(byte)*src] == 0xfe && srclen == 1);
    }
    state_local._4_4_ = s._4_4_;
  }
  return state_local._4_4_;
}

Assistant:

BASE64_DEC_FUNCTION(sse41)
{
#if HAVE_SSE41
	#include "../generic/dec_head.c"
	dec_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/dec_tail.c"
#else
	BASE64_DEC_STUB
#endif
}